

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O0

ResultCode __thiscall kpeg::JPEGDecoder::decodeImageFile(JPEGDecoder *this)

{
  bool bVar1;
  Level LVar2;
  Level LVar3;
  ulong uVar4;
  Logger *pLVar5;
  ostream *poVar6;
  char *pcVar7;
  void *pvVar8;
  istream *piVar9;
  long in_RDI;
  UInt8 in_stack_00000117;
  JPEGDecoder *in_stack_00000118;
  vector<kpeg::MCU,_std::allocator<kpeg::MCU>_> *in_stack_00000158;
  Image *in_stack_00000160;
  ResultCode code;
  ResultCode status;
  UInt8 byte;
  JPEGDecoder *in_stack_00000930;
  char *in_stack_fffffffffffffcc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcc8;
  char *local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  string *psVar10;
  char *in_stack_fffffffffffffd08;
  char *local_2c0;
  char *local_268;
  undefined8 in_stack_fffffffffffffdd8;
  char *local_210;
  char *local_1b8;
  char *local_160;
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [36];
  ResultCode local_ac;
  ResultCode local_a8;
  uchar local_a1;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [48];
  string local_30 [48];
  
  uVar4 = std::ifstream::is_open();
  LVar3 = (Level)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
  if ((uVar4 & 1) != 0) {
    uVar4 = std::ios::good();
    LVar3 = (Level)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
    if ((uVar4 & 1) != 0) {
      pLVar5 = Logger::get();
      LVar3 = Logger::getLevel(pLVar5);
      if (0 < (int)LVar3) {
        pLVar5 = Logger::get();
        poVar6 = Logger::getStream(pLVar5);
        Logger::levelStr_abi_cxx11_((Level)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
        poVar6 = std::operator<<(poVar6,local_a0);
        poVar6 = std::operator<<(poVar6,"[ kpeg:");
        pcVar7 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Decoder.cpp"
                         ,0x2f);
        if (pcVar7 == (char *)0x0) {
          local_1b8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Decoder.cpp"
          ;
        }
        else {
          local_1b8 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Decoder.cpp"
                              ,0x2f);
          local_1b8 = local_1b8 + 1;
        }
        poVar6 = std::operator<<(poVar6,local_1b8);
        poVar6 = std::operator<<(poVar6,":");
        pvVar8 = (void *)std::ostream::operator<<(poVar6,std::dec);
        poVar6 = (ostream *)std::ostream::operator<<(pvVar8,0x62);
        poVar6 = std::operator<<(poVar6," ] ");
        poVar6 = std::operator<<(poVar6,"Started decoding process...");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_a0);
      }
      local_a8 = DECODE_DONE;
      do {
        do {
          piVar9 = (istream *)std::istream::operator>>((istream *)(in_RDI + 0x20),std::noskipws);
          piVar9 = std::operator>>(piVar9,&local_a1);
          bVar1 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar9 + *(long *)(*(long *)piVar9 + -0x18)));
          LVar3 = (Level)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
          if (!bVar1) goto LAB_001605cd;
          if (local_a1 != 0xff) {
            pLVar5 = Logger::get();
            LVar2 = Logger::getLevel(pLVar5);
            if (-1 < (int)LVar2) {
              pLVar5 = Logger::get();
              poVar6 = Logger::getStream(pLVar5);
              Logger::levelStr_abi_cxx11_(LVar3);
              poVar6 = std::operator<<(poVar6,local_d0);
              poVar6 = std::operator<<(poVar6,"[ kpeg:");
              pcVar7 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Decoder.cpp"
                               ,0x2f);
              if (pcVar7 == (char *)0x0) {
                local_210 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Decoder.cpp"
                ;
              }
              else {
                local_210 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Decoder.cpp"
                                    ,0x2f);
                local_210 = local_210 + 1;
              }
              poVar6 = std::operator<<(poVar6,local_210);
              poVar6 = std::operator<<(poVar6,":");
              pvVar8 = (void *)std::ostream::operator<<(poVar6,std::dec);
              poVar6 = (ostream *)std::ostream::operator<<(pvVar8,0x81);
              LVar3 = (Level)((ulong)pvVar8 >> 0x20);
              poVar6 = std::operator<<(poVar6," ] ");
              poVar6 = std::operator<<(poVar6,"[ FATAL ] Invalid JFIF file! Terminating...");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::~string(local_d0);
            }
            local_a8 = ERROR;
            goto LAB_001605cd;
          }
          piVar9 = (istream *)std::istream::operator>>((istream *)(in_RDI + 0x20),std::noskipws);
          std::operator>>(piVar9,&local_a1);
          local_ac = parseSegmentInfo(in_stack_00000118,in_stack_00000117);
          LVar3 = (Level)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
        } while (local_ac == SUCCESS);
        if (local_ac == TERMINATE) {
          local_a8 = TERMINATE;
          goto LAB_001605cd;
        }
      } while (local_ac != DECODE_INCOMPLETE);
      local_a8 = DECODE_INCOMPLETE;
LAB_001605cd:
      if (local_a8 == DECODE_DONE) {
        decodeScanData(in_stack_00000930);
        Image::createImageFromMCUs(in_stack_00000160,in_stack_00000158);
        pLVar5 = Logger::get();
        LVar2 = Logger::getLevel(pLVar5);
        if (0 < (int)LVar2) {
          pLVar5 = Logger::get();
          poVar6 = Logger::getStream(pLVar5);
          Logger::levelStr_abi_cxx11_(LVar3);
          poVar6 = std::operator<<(poVar6,local_f0);
          poVar6 = std::operator<<(poVar6,"[ kpeg:");
          pcVar7 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Decoder.cpp"
                           ,0x2f);
          if (pcVar7 == (char *)0x0) {
            local_268 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Decoder.cpp"
            ;
          }
          else {
            local_268 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Decoder.cpp"
                                ,0x2f);
            local_268 = local_268 + 1;
          }
          poVar6 = std::operator<<(poVar6,local_268);
          poVar6 = std::operator<<(poVar6,":");
          pvVar8 = (void *)std::ostream::operator<<(poVar6,std::dec);
          poVar6 = (ostream *)std::ostream::operator<<(pvVar8,0x8b);
          poVar6 = std::operator<<(poVar6," ] ");
          poVar6 = std::operator<<(poVar6,"Finished decoding process [OK].");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_f0);
        }
      }
      else if (local_a8 == TERMINATE) {
        pLVar5 = Logger::get();
        LVar2 = Logger::getLevel(pLVar5);
        if (0 < (int)LVar2) {
          pLVar5 = Logger::get();
          poVar6 = Logger::getStream(pLVar5);
          Logger::levelStr_abi_cxx11_(LVar3);
          poVar6 = std::operator<<(poVar6,local_110);
          poVar6 = std::operator<<(poVar6,"[ kpeg:");
          pcVar7 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Decoder.cpp"
                           ,0x2f);
          if (pcVar7 == (char *)0x0) {
            local_2c0 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Decoder.cpp"
            ;
          }
          else {
            local_2c0 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Decoder.cpp"
                                ,0x2f);
            local_2c0 = local_2c0 + 1;
          }
          poVar6 = std::operator<<(poVar6,local_2c0);
          poVar6 = std::operator<<(poVar6,":");
          pvVar8 = (void *)std::ostream::operator<<(poVar6,std::dec);
          poVar6 = (ostream *)std::ostream::operator<<(pvVar8,0x8f);
          poVar6 = std::operator<<(poVar6," ] ");
          poVar6 = std::operator<<(poVar6,"Terminated decoding process [NOT-OK].");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_110);
        }
      }
      else if (local_a8 == DECODE_INCOMPLETE) {
        pLVar5 = Logger::get();
        LVar2 = Logger::getLevel(pLVar5);
        if (0 < (int)LVar2) {
          pLVar5 = Logger::get();
          poVar6 = Logger::getStream(pLVar5);
          psVar10 = local_130;
          Logger::levelStr_abi_cxx11_(LVar3);
          poVar6 = std::operator<<(poVar6,psVar10);
          poVar6 = std::operator<<(poVar6,"[ kpeg:");
          pcVar7 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Decoder.cpp"
                           ,0x2f);
          if (pcVar7 == (char *)0x0) {
            local_318 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Decoder.cpp"
            ;
          }
          else {
            local_318 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Decoder.cpp"
                                ,0x2f);
            local_318 = local_318 + 1;
          }
          poVar6 = std::operator<<(poVar6,local_318);
          poVar6 = std::operator<<(poVar6,":");
          pvVar8 = (void *)std::ostream::operator<<(poVar6,std::dec);
          poVar6 = (ostream *)std::ostream::operator<<(pvVar8,0x94);
          poVar6 = std::operator<<(poVar6," ] ");
          poVar6 = std::operator<<(poVar6,"Decoding process incomplete [NOT-OK].");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_130);
        }
      }
      return local_a8;
    }
  }
  pLVar5 = Logger::get();
  LVar2 = Logger::getLevel(pLVar5);
  if (-1 < (int)LVar2) {
    pLVar5 = Logger::get();
    poVar6 = Logger::getStream(pLVar5);
    Logger::levelStr_abi_cxx11_(LVar3);
    poVar6 = std::operator<<(poVar6,local_30);
    poVar6 = std::operator<<(poVar6,"[ kpeg:");
    pcVar7 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Decoder.cpp"
                     ,0x2f);
    if (pcVar7 == (char *)0x0) {
      local_160 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Decoder.cpp"
      ;
    }
    else {
      local_160 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Decoder.cpp"
                          ,0x2f);
      local_160 = local_160 + 1;
    }
    poVar6 = std::operator<<(poVar6,local_160);
    poVar6 = std::operator<<(poVar6,":");
    pvVar8 = (void *)std::ostream::operator<<(poVar6,std::dec);
    poVar6 = (ostream *)std::ostream::operator<<(pvVar8,0x5e);
    poVar6 = std::operator<<(poVar6," ] ");
    std::operator+(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    std::operator+(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    poVar6 = std::operator<<(poVar6,local_60);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_30);
  }
  return ERROR;
}

Assistant:

JPEGDecoder::ResultCode JPEGDecoder::decodeImageFile()
    {
        if ( !m_imageFile.is_open() || !m_imageFile.good() )
        {
            LOG(Logger::Level::ERROR) << "Unable scan image file: \'" + m_filename + "\'" << std::endl;
            return ResultCode::ERROR;
        }
        
        LOG(Logger::Level::INFO) << "Started decoding process..." << std::endl;
        
        UInt8 byte;
        ResultCode status = ResultCode::DECODE_DONE;
        
        // TODO: Fix this spaghetti code for keeping track of decode status
        
        while ( m_imageFile >> std::noskipws >> byte )
        {
            if ( byte == JFIF_BYTE_FF )
            {
                m_imageFile >> std::noskipws >> byte;
                
                ResultCode code = parseSegmentInfo(byte);
                
                if ( code == ResultCode::SUCCESS )
                    continue;
                else if ( code == ResultCode::TERMINATE )
                {
                    status = ResultCode::TERMINATE;
                    break;
                }
                else if ( code == ResultCode::DECODE_INCOMPLETE )
                {
                    status = ResultCode::DECODE_INCOMPLETE;
                    break;
                }
            }
            else
            {
                //std::cout <<m_imageFile.tellg() << "ZZZZZZ: " << std::hex << byte << std::endl;
                LOG(Logger::Level::ERROR) << "[ FATAL ] Invalid JFIF file! Terminating..." << std::endl;
                status = ResultCode::ERROR;
                break;
            }
        }
        
        if ( status == ResultCode::DECODE_DONE )
        {
            decodeScanData();
            m_image.createImageFromMCUs( m_MCU );
            LOG(Logger::Level::INFO) << "Finished decoding process [OK]." << std::endl;
        }
        else if ( status == ResultCode::TERMINATE )
        {
            LOG(Logger::Level::INFO) << "Terminated decoding process [NOT-OK]." << std::endl;
        }
        
        else if ( status == ResultCode::DECODE_INCOMPLETE )
        {
            LOG(Logger::Level::INFO) << "Decoding process incomplete [NOT-OK]." << std::endl;
        }
        
        return status;
    }